

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaXPathEvaluate(xmlSchemaValidCtxtPtr vctxt,xmlElementType nodeType)

{
  int iVar1;
  uint uVar2;
  xmlSchemaIDCStateObjPtr_conflict pxVar3;
  xmlChar *name;
  xmlChar *ns;
  int iVar4;
  int *piVar5;
  xmlNodePtr extraout_RDX;
  xmlNodePtr extraout_RDX_00;
  xmlNodePtr node;
  xmlSchemaIDCStateObjPtr pxVar6;
  char *extra;
  xmlSchemaIDCSelectPtr_conflict sel;
  xmlSchemaIDCStateObjPtr_conflict pxVar7;
  int local_40;
  
  pxVar3 = vctxt->xpathStates;
  if (pxVar3 == (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    local_40 = 0;
  }
  else {
    iVar1 = vctxt->depth;
    local_40 = 0;
    pxVar6 = pxVar3;
    pxVar7 = (xmlSchemaIDCStateObjPtr_conflict)0x0;
    while (pxVar6 != pxVar7) {
      name = vctxt->inode->localName;
      ns = vctxt->inode->nsName;
      if (nodeType == XML_ELEMENT_NODE) {
        iVar4 = xmlStreamPush((xmlStreamCtxtPtr)pxVar6->xpathCtxt,name,ns);
      }
      else {
        iVar4 = xmlStreamPushAttr((xmlStreamCtxtPtr)pxVar6->xpathCtxt,name,ns);
      }
      if (iVar4 != 0) {
        if (iVar4 == -1) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaXPathEvaluate",
                     "calling xmlStreamPush()");
          return -1;
        }
        piVar5 = pxVar6->history;
        if (piVar5 == (int *)0x0) {
          piVar5 = (int *)(*xmlMalloc)(0x14);
          pxVar6->history = piVar5;
          if (piVar5 == (int *)0x0) {
            extra = "allocating the state object history";
            node = extraout_RDX_00;
LAB_001be61c:
            xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,extra,node);
            return -1;
          }
          pxVar6->sizeHistory = 5;
        }
        else {
          iVar4 = pxVar6->sizeHistory;
          if (iVar4 <= pxVar6->nbHistory) {
            pxVar6->sizeHistory = iVar4 * 2;
            piVar5 = (int *)(*xmlRealloc)(piVar5,(long)iVar4 << 3);
            pxVar6->history = piVar5;
            if (piVar5 == (int *)0x0) {
              extra = "re-allocating the state object history";
              node = extraout_RDX;
              goto LAB_001be61c;
            }
          }
        }
        iVar4 = pxVar6->nbHistory;
        pxVar6->nbHistory = iVar4 + 1;
        piVar5[iVar4] = (uint)(nodeType == XML_ATTRIBUTE_NODE) + iVar1;
        if (pxVar6->type == 2) {
          if (local_40 == 0) {
            uVar2 = vctxt->inode->flags;
            if ((uVar2 & 0x10) == 0) {
              vctxt->inode->flags = uVar2 | 0x10;
            }
          }
          local_40 = local_40 + 1;
        }
        else if (pxVar6->type == 1) {
          sel = (xmlSchemaIDCSelectPtr_conflict)&pxVar6->matcher->aidc->def->fields;
          while (sel = sel->next, sel != (xmlSchemaIDCSelectPtr_conflict)0x0) {
            iVar4 = xmlSchemaIDCAddStateObject(vctxt,pxVar6->matcher,sel,2);
            if (iVar4 == -1) {
              return -1;
            }
          }
        }
      }
      pxVar6 = pxVar6->next;
      if (pxVar6 == (xmlSchemaIDCStateObjPtr)0x0) {
        pxVar6 = vctxt->xpathStates;
        pxVar7 = pxVar3;
      }
    }
  }
  return local_40;
}

Assistant:

static int
xmlSchemaXPathEvaluate(xmlSchemaValidCtxtPtr vctxt,
		       xmlElementType nodeType)
{
    xmlSchemaIDCStateObjPtr sto, head = NULL, first;
    int res, resolved = 0, depth = vctxt->depth;

    if (vctxt->xpathStates == NULL)
	return (0);

    if (nodeType == XML_ATTRIBUTE_NODE)
	depth++;
#ifdef DEBUG_IDC
    {
	xmlChar *str = NULL;
	xmlGenericError(xmlGenericErrorContext,
	    "IDC: EVAL on %s, depth %d, type %d\n",
	    xmlSchemaFormatQName(&str, vctxt->inode->nsName,
		vctxt->inode->localName), depth, nodeType);
	FREE_AND_NULL(str)
    }
#endif
    /*
    * Process all active XPath state objects.
    */
    first = vctxt->xpathStates;
    sto = first;
    while (sto != head) {
#ifdef DEBUG_IDC
	if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_SELECTOR)
	    xmlGenericError(xmlGenericErrorContext, "IDC:   ['%s'] selector '%s'\n",
		sto->matcher->aidc->def->name, sto->sel->xpath);
	else
	    xmlGenericError(xmlGenericErrorContext, "IDC:   ['%s'] field '%s'\n",
		sto->matcher->aidc->def->name, sto->sel->xpath);
#endif
	if (nodeType == XML_ELEMENT_NODE)
	    res = xmlStreamPush((xmlStreamCtxtPtr) sto->xpathCtxt,
		vctxt->inode->localName, vctxt->inode->nsName);
	else
	    res = xmlStreamPushAttr((xmlStreamCtxtPtr) sto->xpathCtxt,
		vctxt->inode->localName, vctxt->inode->nsName);

	if (res == -1) {
	    VERROR_INT("xmlSchemaXPathEvaluate",
		"calling xmlStreamPush()");
	    return (-1);
	}
	if (res == 0)
	    goto next_sto;
	/*
	* Full match.
	*/
#ifdef DEBUG_IDC
	xmlGenericError(xmlGenericErrorContext, "IDC:     "
	    "MATCH\n");
#endif
	/*
	* Register a match in the state object history.
	*/
	if (sto->history == NULL) {
	    sto->history = (int *) xmlMalloc(5 * sizeof(int));
	    if (sto->history == NULL) {
		xmlSchemaVErrMemory(NULL,
		    "allocating the state object history", NULL);
		return(-1);
	    }
	    sto->sizeHistory = 5;
	} else if (sto->sizeHistory <= sto->nbHistory) {
	    sto->sizeHistory *= 2;
	    sto->history = (int *) xmlRealloc(sto->history,
		sto->sizeHistory * sizeof(int));
	    if (sto->history == NULL) {
		xmlSchemaVErrMemory(NULL,
		    "re-allocating the state object history", NULL);
		return(-1);
	    }
	}
	sto->history[sto->nbHistory++] = depth;

#ifdef DEBUG_IDC
	xmlGenericError(xmlGenericErrorContext, "IDC:       push match '%d'\n",
	    vctxt->depth);
#endif

	if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_SELECTOR) {
	    xmlSchemaIDCSelectPtr sel;
	    /*
	    * Activate state objects for the IDC fields of
	    * the IDC selector.
	    */
#ifdef DEBUG_IDC
	    xmlGenericError(xmlGenericErrorContext, "IDC:     "
		"activating field states\n");
#endif
	    sel = sto->matcher->aidc->def->fields;
	    while (sel != NULL) {
		if (xmlSchemaIDCAddStateObject(vctxt, sto->matcher,
		    sel, XPATH_STATE_OBJ_TYPE_IDC_FIELD) == -1)
		    return (-1);
		sel = sel->next;
	    }
	} else if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_FIELD) {
	    /*
	    * An IDC key node was found by the IDC field.
	    */
#ifdef DEBUG_IDC
	    xmlGenericError(xmlGenericErrorContext,
		"IDC:     key found\n");
#endif
	    /*
	    * Notify that the character value of this node is
	    * needed.
	    */
	    if (resolved == 0) {
		if ((vctxt->inode->flags &
		    XML_SCHEMA_NODE_INFO_VALUE_NEEDED) == 0)
		vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_VALUE_NEEDED;
	    }
	    resolved++;
	}
next_sto:
	if (sto->next == NULL) {
	    /*
	    * Evaluate field state objects created on this node as well.
	    */
	    head = first;
	    sto = vctxt->xpathStates;
	} else
	    sto = sto->next;
    }
    return (resolved);
}